

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solver.cc
# Opt level: O2

Loss * __thiscall xLearn::Solver::create_loss(Solver *this)

{
  ObjectCreatorRegistry_xLearn_loss_registry *this_00;
  Loss *pLVar1;
  ostream *poVar2;
  allocator local_56;
  allocator local_55;
  Logger local_54;
  string local_50;
  string local_30;
  
  this_00 = GetRegistry_xLearn_loss_registry();
  std::__cxx11::string::string
            ((string *)&local_50,(this->hyper_param_).loss_func._M_dataplus._M_p,
             (allocator *)&local_30);
  pLVar1 = ObjectCreatorRegistry_xLearn_loss_registry::CreateObject(this_00,&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  if (pLVar1 == (Loss *)0x0) {
    local_54.severity_ = FATAL;
    std::__cxx11::string::string
              ((string *)&local_50,
               "/workspace/llm4binary/github/license_c_cmakelists/aksnzhy[P]xlearn/src/solver/solver.cc"
               ,&local_55);
    std::__cxx11::string::string((string *)&local_30,"create_loss",&local_56);
    poVar2 = Logger::Start(FATAL,&local_50,0x61,&local_30);
    poVar2 = std::operator<<(poVar2,"Cannot create loss: ");
    std::operator<<(poVar2,(string *)&(this->hyper_param_).loss_func);
    std::__cxx11::string::~string((string *)&local_30);
    std::__cxx11::string::~string((string *)&local_50);
    Logger::~Logger(&local_54);
  }
  return pLVar1;
}

Assistant:

Loss* Solver::create_loss() {
  Loss* loss;
  loss = CREATE_LOSS(hyper_param_.loss_func.c_str());
  if (loss == nullptr) {
    LOG(FATAL) << "Cannot create loss: "
               << hyper_param_.loss_func;
  }
  return loss;
}